

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

void nn_sws_acknowledge_close_handshake(nn_sws *self)

{
  uint16_t uVar1;
  int iVar2;
  long in_RDI;
  size_t len;
  int code_point_len;
  uint16_t close_code;
  uint8_t *pos;
  uint8_t *in_stack_ffffffffffffffd8;
  ulong local_20;
  
  local_20 = *(ulong *)(in_RDI + 0x1688);
  if (local_20 == 0) {
    nn_sws_fail_conn(self,pos._4_4_,_code_point_len);
  }
  else {
    if (local_20 < 2) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","len >= NN_SWS_CLOSE_CODE_LEN",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x2c2);
      fflush(_stderr);
      nn_err_abort();
    }
    for (local_20 = local_20 - 2; local_20 != 0; local_20 = local_20 - (long)iVar2) {
      iVar2 = nn_utf8_code_point(in_stack_ffffffffffffffd8,0x15a5b6);
      if (iVar2 < 1) {
        nn_sws_fail_conn(self,pos._4_4_,_code_point_len);
        return;
      }
      if (local_20 < (ulong)(long)iVar2) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","len >= (size_t) code_point_len",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
                ,0x2cd);
        fflush(_stderr);
        nn_err_abort();
      }
    }
    uVar1 = nn_gets(*(uint8_t **)(in_RDI + 0x1680));
    if ((((((uVar1 == 1000) || (uVar1 == 0x3e9)) || (uVar1 == 0x3ea)) ||
         ((uVar1 == 0x3eb || (uVar1 == 0x3ef)))) ||
        (((uVar1 == 0x3f0 || ((uVar1 == 0x3f1 || (uVar1 == 0x3f2)))) || (uVar1 == 0x3f3)))) ||
       (((2999 < uVar1 && (uVar1 < 4000)) || ((3999 < uVar1 && (uVar1 < 5000)))))) {
      nn_sws_fail_conn(self,pos._4_4_,_code_point_len);
    }
    else {
      nn_sws_fail_conn(self,pos._4_4_,_code_point_len);
    }
  }
  return;
}

Assistant:

static void nn_sws_acknowledge_close_handshake (struct nn_sws *self)
{
    uint8_t *pos;
    uint16_t close_code;
    int code_point_len;
    size_t len;

    len = self->inmsg_current_chunk_len;
    pos = self->inmsg_current_chunk_buf;

    /*  Peer did not provide a Close Code, so choose our own here. */
    if (len == 0) {
        nn_sws_fail_conn (self, NN_SWS_CLOSE_NORMAL, "");
        return;
    }

    /*  If the payload is not even long enough for the required 2-octet
        Close Code, the connection should have already been failed. */
    nn_assert (len >= NN_SWS_CLOSE_CODE_LEN);
    len -= NN_SWS_CLOSE_CODE_LEN;
    pos += NN_SWS_CLOSE_CODE_LEN;

    /*  As per RFC 6455 7.1.6, the Close Reason following the Close Code
        must be well-formed UTF-8. */
    while (len > 0) {
        code_point_len = nn_utf8_code_point (pos, len);

        if (code_point_len > 0) {
            /*  Valid code point found; continue validating. */
            nn_assert (len >= (size_t) code_point_len);
            len -= code_point_len;
            pos += code_point_len;
            continue;
        }
        else {
            /*  RFC 6455 7.1.6 */
            nn_sws_fail_conn (self, NN_SWS_CLOSE_ERR_PROTO,
                "Invalid UTF-8 sent as Close Reason.");
            return;
        }
    }

    /*  Entire Close Reason is well-formed UTF-8 (or empty) */
    nn_assert (len == 0);

    close_code = nn_gets (self->inmsg_current_chunk_buf);

    if (close_code == NN_SWS_CLOSE_NORMAL ||
        close_code == NN_SWS_CLOSE_GOING_AWAY ||
        close_code == NN_SWS_CLOSE_ERR_PROTO ||
        close_code == NN_SWS_CLOSE_ERR_WUT ||
        close_code == NN_SWS_CLOSE_ERR_INVALID_FRAME ||
        close_code == NN_SWS_CLOSE_ERR_POLICY ||
        close_code == NN_SWS_CLOSE_ERR_TOOBIG ||
        close_code == NN_SWS_CLOSE_ERR_EXTENSION ||
        close_code == NN_SWS_CLOSE_ERR_SERVER ||
        (close_code >= 3000 && close_code <= 3999) ||
        (close_code >= 4000 && close_code <= 4999)) {
        /*  Repeat close code, per RFC 6455 7.4.1 and 7.4.2 */
        nn_sws_fail_conn (self, (int) close_code, "");
    }
    else {
        nn_sws_fail_conn (self, NN_SWS_CLOSE_ERR_PROTO,
            "Unrecognized close code.");
    }

    return;
}